

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int disas_neon_insn_2reg_scalar_ext(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  target_ulong tVar1;
  byte bVar2;
  bool bVar3;
  _Bool _Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  code *pcVar7;
  long lVar8;
  bool bVar9;
  TCGv_ptr local_88;
  TCGv_ptr ptr;
  int index_1;
  int m;
  int vm3;
  int vm20;
  int is_s;
  int u;
  int index;
  int size;
  int rot;
  _Bool ptr_is_env;
  _Bool q;
  uint32_t uStack_50;
  _Bool is_long;
  int off_rm;
  int off_rn;
  int data;
  int opr_sz;
  int rm;
  int rn;
  int rd;
  undefined1 *fn_gvec_ptr;
  gen_helper_gvec_3_conflict1 *fn_gvec;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  fn_gvec_ptr = (undefined1 *)0x0;
  _rn = (code *)0x0;
  bVar2 = 0;
  uVar5 = extract32(insn,6,1);
  bVar9 = uVar5 != 0;
  bVar3 = false;
  if ((insn & 0xff000f10) == 0xfe000800) {
    uVar5 = extract32(insn,0x14,2);
    uVar6 = extract32(insn,0x17,1);
    _Var4 = isar_feature_aa32_vcma(s->isar);
    if (!_Var4) {
      return 1;
    }
    if (uVar6 == 0) {
      _Var4 = isar_feature_aa32_fp16_arith(s->isar);
      if (!_Var4) {
        return 1;
      }
      data = extract32(insn,0,4);
      is_s = extract32(insn,5,1);
    }
    else {
      _Var4 = isar_feature_aa32_simd_r32(s->isar);
      if (_Var4) {
        data = insn & 0xf | insn >> 1 & 0x10;
      }
      else {
        if ((insn & 0x20) != 0) {
          return 1;
        }
        data = insn & 0xf;
      }
      is_s = 0;
    }
    off_rm = is_s << 2 | uVar5;
    _rn = gen_helper_gvec_fcmlah_idx;
    if (uVar6 != 0) {
      _rn = gen_helper_gvec_fcmlas_idx;
    }
  }
  else if ((insn & 0xffb00f00) == 0xfe200d00) {
    uVar5 = extract32(insn,4,1);
    _Var4 = isar_feature_aa32_dp(s->isar);
    if (!_Var4) {
      return 1;
    }
    pcVar7 = gen_helper_gvec_sdot_idx_b;
    if (uVar5 != 0) {
      pcVar7 = gen_helper_gvec_udot_idx_b;
    }
    off_rm = extract32(insn,5,1);
    data = extract32(insn,0,4);
    fn_gvec_ptr = pcVar7;
  }
  else {
    if ((insn & 0xffa00f10) != 0xfe000810) {
      return 1;
    }
    uVar5 = extract32(insn,0x14,1);
    data = extract32(insn,0,3);
    ptr._4_4_ = extract32(insn,3,1);
    uVar6 = extract32(insn,5,1);
    _Var4 = isar_feature_aa32_fhm(s->isar);
    if (!_Var4) {
      return 1;
    }
    if (bVar9) {
      ptr._4_4_ = uVar6 * 2 + ptr._4_4_;
    }
    else {
      data = data * 2 + uVar6;
    }
    bVar2 = 1;
    off_rm = ptr._4_4_ << 2 | uVar5;
    _rn = gen_helper_gvec_fmlal_idx_a32;
    bVar3 = true;
  }
  _Var4 = isar_feature_aa32_simd_r32(s->isar);
  if (_Var4) {
    rm = insn >> 0xc & 0xf | insn >> 0x12 & 0x10;
  }
  else {
    if ((insn & 0x400000) != 0) {
      return 1;
    }
    rm = insn >> 0xc & 0xf;
  }
  if ((rm & (uint)bVar9) == 0) {
    if ((bVar9) || (bVar2 == 0)) {
      _Var4 = isar_feature_aa32_simd_r32(s->isar);
      if (_Var4) {
        opr_sz = insn >> 0x10 & 0xf | insn >> 3 & 0x10;
      }
      else {
        if ((insn & 0x80) != 0) {
          return 1;
        }
        opr_sz = insn >> 0x10 & 0xf;
      }
      if ((opr_sz & (uint)bVar9 & (uint)(bVar2 ^ 1)) != 0) {
        return 1;
      }
      lVar8 = vfp_reg_offset(true,opr_sz);
      uStack_50 = (uint32_t)lVar8;
      lVar8 = vfp_reg_offset(true,data);
      rot = (int)lVar8;
    }
    else {
      lVar8 = vfp_reg_offset(false,insn >> 0xf & 0x1e | insn >> 7 & 1);
      uStack_50 = (uint32_t)lVar8;
      lVar8 = vfp_reg_offset(false,data);
      rot = (int)lVar8;
    }
    if (s->fp_excp_el == 0) {
      if ((s->vfp_enabled & 1U) == 0) {
        s_local._4_4_ = 1;
      }
      else {
        uVar5 = (bVar9 + 1) * 8;
        if (_rn == (code *)0x0) {
          lVar8 = vfp_reg_offset(true,rm);
          tcg_gen_gvec_3_ool_aarch64
                    (tcg_ctx_00,(uint32_t)lVar8,uStack_50,rot,uVar5,uVar5,off_rm,
                     (gen_helper_gvec_3_conflict1 *)fn_gvec_ptr);
        }
        else {
          if (bVar3) {
            local_88 = tcg_ctx_00->cpu_env;
          }
          else {
            local_88 = get_fpstatus_ptr_aarch64(tcg_ctx_00,1);
          }
          lVar8 = vfp_reg_offset(true,rm);
          tcg_gen_gvec_3_ptr_aarch64
                    (tcg_ctx_00,(uint32_t)lVar8,uStack_50,rot,local_88,uVar5,uVar5,off_rm,_rn);
          if (!bVar3) {
            tcg_temp_free_ptr(tcg_ctx_00,local_88);
          }
        }
        s_local._4_4_ = 0;
      }
    }
    else {
      tVar1 = s->pc_curr;
      uVar5 = syn_simd_access_trap(1,0xe,false);
      gen_exception_insn(s,(uint32_t)tVar1,1,uVar5,s->fp_excp_el);
      s_local._4_4_ = 0;
    }
  }
  else {
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static int disas_neon_insn_2reg_scalar_ext(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_gvec_3 *fn_gvec = NULL;
    gen_helper_gvec_3_ptr *fn_gvec_ptr = NULL;
    int rd, rn, rm, opr_sz, data;
    int off_rn, off_rm;
    bool is_long = false, q = extract32(insn, 6, 1);
    bool ptr_is_env = false;

    if ((insn & 0xff000f10) == 0xfe000800) {
        /* VCMLA (indexed) -- 1111 1110 S.RR .... .... 1000 ...0 .... */
        int rot = extract32(insn, 20, 2);
        int size = extract32(insn, 23, 1);
        int index;

        if (!dc_isar_feature(aa32_vcma, s)) {
            return 1;
        }
        if (size == 0) {
            if (!dc_isar_feature(aa32_fp16_arith, s)) {
                return 1;
            }
            /* For fp16, rm is just Vm, and index is M.  */
            rm = extract32(insn, 0, 4);
            index = extract32(insn, 5, 1);
        } else {
            /* For fp32, rm is the usual M:Vm, and index is 0.  */
            VFP_DREG_M(rm, insn);
            index = 0;
        }
        data = (index << 2) | rot;
        fn_gvec_ptr = (size ? gen_helper_gvec_fcmlas_idx
                       : gen_helper_gvec_fcmlah_idx);
    } else if ((insn & 0xffb00f00) == 0xfe200d00) {
        /* V[US]DOT -- 1111 1110 0.10 .... .... 1101 .Q.U .... */
        int u = extract32(insn, 4, 1);

        if (!dc_isar_feature(aa32_dp, s)) {
            return 1;
        }
        fn_gvec = u ? gen_helper_gvec_udot_idx_b : gen_helper_gvec_sdot_idx_b;
        /* rm is just Vm, and index is M.  */
        data = extract32(insn, 5, 1); /* index */
        rm = extract32(insn, 0, 4);
    } else if ((insn & 0xffa00f10) == 0xfe000810) {
        /* VFM[AS]L -- 1111 1110 0.0S .... .... 1000 .Q.1 .... */
        int is_s = extract32(insn, 20, 1);
        int vm20 = extract32(insn, 0, 3);
        int vm3 = extract32(insn, 3, 1);
        int m = extract32(insn, 5, 1);
        int index;

        if (!dc_isar_feature(aa32_fhm, s)) {
            return 1;
        }
        if (q) {
            rm = vm20;
            index = m * 2 + vm3;
        } else {
            rm = vm20 * 2 + m;
            index = vm3;
        }
        is_long = true;
        data = (index << 2) | is_s; /* is_2 == 0 */
        fn_gvec_ptr = gen_helper_gvec_fmlal_idx_a32;
        ptr_is_env = true;
    } else {
        return 1;
    }

    VFP_DREG_D(rd, insn);
    if (rd & q) {
        return 1;
    }
    if (q || !is_long) {
        VFP_DREG_N(rn, insn);
        if (rn & q & !is_long) {
            return 1;
        }
        off_rn = vfp_reg_offset(1, rn);
        off_rm = vfp_reg_offset(1, rm);
    } else {
        rn = VFP_SREG_N(insn);
        off_rn = vfp_reg_offset(0, rn);
        off_rm = vfp_reg_offset(0, rm);
    }
    if (s->fp_excp_el) {
        gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                           syn_simd_access_trap(1, 0xe, false), s->fp_excp_el);
        return 0;
    }
    if (!s->vfp_enabled) {
        return 1;
    }

    opr_sz = (1 + q) * 8;
    if (fn_gvec_ptr) {
        TCGv_ptr ptr;
        if (ptr_is_env) {
            ptr = tcg_ctx->cpu_env;
        } else {
            ptr = get_fpstatus_ptr(tcg_ctx, 1);
        }
        tcg_gen_gvec_3_ptr(tcg_ctx, vfp_reg_offset(1, rd), off_rn, off_rm, ptr,
                           opr_sz, opr_sz, data, fn_gvec_ptr);
        if (!ptr_is_env) {
            tcg_temp_free_ptr(tcg_ctx, ptr);
        }
    } else {
        tcg_gen_gvec_3_ool(tcg_ctx, vfp_reg_offset(1, rd), off_rn, off_rm,
                           opr_sz, opr_sz, data, fn_gvec);
    }
    return 0;
}